

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask15_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 0xf | uVar2;
  *out = uVar2;
  uVar1 = in[2];
  *out = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[1] = uVar1;
  uVar1 = in[3] << 0xd | uVar1;
  out[1] = uVar1;
  uVar2 = in[4];
  out[1] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[2] = uVar2;
  uVar2 = in[5] << 0xb | uVar2;
  out[2] = uVar2;
  uVar1 = in[6];
  out[2] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[3] = uVar1;
  out[3] = in[7] << 9 | uVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask15_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;

  return out + 1;
}